

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void __thiscall
charls::process_transformed<charls::transform_none<unsigned_char>_>::encode_transform
          (process_transformed<charls::transform_none<unsigned_char>_> *this,void *source,
          void *destination,size_t pixel_count,size_t destination_stride)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  interleave_mode iVar8;
  pointer puVar9;
  long lVar10;
  size_t sVar11;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *paVar12;
  
  if (this->parameters_->output_bgr == true) {
    memcpy((this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start,source,pixel_count * 3);
    if (pixel_count != 0) {
      iVar6 = this->frame_info_->component_count;
      puVar9 = (this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + 2;
      sVar11 = pixel_count;
      do {
        uVar1 = puVar9[-2];
        puVar9[-2] = *puVar9;
        *puVar9 = uVar1;
        puVar9 = puVar9 + iVar6;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
    }
    source = (this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  iVar6 = this->frame_info_->component_count;
  if (iVar6 == 4) {
    iVar8 = this->parameters_->interleave_mode;
    if (iVar8 == Line) {
      if (destination_stride <= pixel_count) {
        pixel_count = destination_stride;
      }
      if (pixel_count != 0) {
        bVar2 = (byte)this->mask_;
        sVar11 = 0;
        do {
          bVar3 = (((quad<unsigned_char> *)((long)source + sVar11 * 4))->field_0).v4;
          bVar4 = (((quad<unsigned_char> *)((long)source + sVar11 * 4))->
                  super_triplet<unsigned_char>).field_1.v2;
          bVar5 = (((quad<unsigned_char> *)((long)source + sVar11 * 4))->
                  super_triplet<unsigned_char>).field_2.v3;
          *(byte *)((long)destination + sVar11) =
               (((quad<unsigned_char> *)((long)source + sVar11 * 4))->super_triplet<unsigned_char>).
               field_0.v1 & bVar2;
          *(byte *)((long)destination + sVar11 + destination_stride) = bVar4 & bVar2;
          *(byte *)((long)destination + sVar11 + destination_stride * 2) = bVar5 & bVar2;
          *(byte *)((long)destination + sVar11 + destination_stride * 3) = bVar3 & bVar2;
          sVar11 = sVar11 + 1;
        } while (pixel_count != sVar11);
      }
    }
    else if (iVar8 == Sample) {
      transform_line<charls::transform_none<unsigned_char>,unsigned_char>
                ((quad<unsigned_char> *)destination,(quad<unsigned_char> *)source,pixel_count,
                 (transform_none<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
  }
  else if (iVar6 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      if (pixel_count != 0) {
        uVar7 = this->mask_;
        lVar10 = 0;
        do {
          bVar2 = (&(((quad<unsigned_char> *)source)->super_triplet<unsigned_char>).field_0)[lVar10]
                  .v1;
          bVar3 = (&(((quad<unsigned_char> *)source)->super_triplet<unsigned_char>).field_1)[lVar10]
                  .v2;
          *(byte *)((long)destination + lVar10 + 2) =
               (&(((quad<unsigned_char> *)source)->super_triplet<unsigned_char>).field_2)[lVar10].v3
               & (byte)uVar7;
          *(ushort *)((long)destination + lVar10) =
               (ushort)((bVar3 & uVar7) << 8) | (ushort)bVar2 & (ushort)uVar7;
          lVar10 = lVar10 + 3;
          pixel_count = pixel_count - 1;
        } while (pixel_count != 0);
      }
    }
    else {
      if (destination_stride <= pixel_count) {
        pixel_count = destination_stride;
      }
      if (pixel_count != 0) {
        bVar2 = (byte)this->mask_;
        paVar12 = &(((quad<unsigned_char> *)source)->super_triplet<unsigned_char>).field_2;
        sVar11 = 0;
        do {
          bVar3 = ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(paVar12 + -1))->v2;
          bVar4 = paVar12->v3;
          *(byte *)((long)destination + sVar11) =
               (((triplet<unsigned_char> *)(paVar12 + -2))->field_0).v1 & bVar2;
          *(byte *)((long)destination + sVar11 + destination_stride) = bVar3 & bVar2;
          *(byte *)((long)destination + sVar11 + destination_stride * 2) = bVar4 & bVar2;
          sVar11 = sVar11 + 1;
          paVar12 = paVar12 + 3;
        } while (pixel_count != sVar11);
      }
    }
  }
  return;
}

Assistant:

void encode_transform(const void* source, void* destination, const size_t pixel_count,
                          const size_t destination_stride) noexcept
    {
        if (parameters_.output_bgr)
        {
            memcpy(temp_line_.data(), source, sizeof(triplet<size_type>) * pixel_count);
            transform_rgb_to_bgr(temp_line_.data(), frame_info_.component_count, pixel_count);
            source = temp_line_.data();
        }

        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else
            {
                transform_triplet_to_line(static_cast<const triplet<size_type>*>(source), pixel_count,
                                          static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_quad_to_line(static_cast<const quad<size_type>*>(source), pixel_count,
                                       static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
    }